

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Copysign_f32(w3Interp *this)

{
  float *pfVar1;
  float fVar2;
  float local_2c;
  float *z1;
  float z2;
  w3Interp *this_local;
  
  fVar2 = w3Stack::pop_f32(&this->super_w3Stack);
  pfVar1 = w3Stack::f32(&this->super_w3Stack);
  if (fVar2 < 0.0 == (*pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
    local_2c = *pfVar1;
  }
  else {
    local_2c = -*pfVar1;
  }
  *pfVar1 = local_2c;
  return;
}

Assistant:

INTERP (Copysign_f32)
{
    const float z2 = pop_f32 ();
    float& z1 = f32 ();
    z1 = ((z2 < 0) != (z1 < 0)) ? -z1 : z1;
}